

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTD_CCtx_params * ZSTD_createCCtxParams(void)

{
  ZSTD_CCtx_params *__s;
  
  __s = (ZSTD_CCtx_params *)calloc(1,0xd0);
  if (__s == (ZSTD_CCtx_params *)0x0) {
    __s = (ZSTD_CCtx_params *)0x0;
  }
  else {
    memset(__s,0,0xd0);
    __s->compressionLevel = 3;
    (__s->fParams).contentSizeFlag = 1;
    (__s->customMem).customAlloc = (ZSTD_allocFunction)0x0;
    (__s->customMem).customFree = (ZSTD_freeFunction)0x0;
    (__s->customMem).opaque = (void *)0x0;
  }
  return __s;
}

Assistant:

MEM_STATIC void* ZSTD_customCalloc(size_t size, ZSTD_customMem customMem)
{
    if (customMem.customAlloc) {
        /* calloc implemented as malloc+memset;
         * not as efficient as calloc, but next best guess for custom malloc */
        void* const ptr = customMem.customAlloc(customMem.opaque, size);
        ZSTD_memset(ptr, 0, size);
        return ptr;
    }
    return ZSTD_calloc(1, size);
}